

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

size_t Extract(string *where_from,string *where_to,size_t pos,char delim)

{
  char in_CL;
  string *in_RSI;
  string *in_RDI;
  size_t end;
  string asStack_48 [32];
  size_t local_28;
  string *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = std::__cxx11::string::find_first_of((char)in_RDI,(ulong)(uint)(int)in_CL);
  if (local_28 == 0xffffffffffffffff) {
    std::__cxx11::string::operator=(local_10,local_8);
  }
  else {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)local_8);
    std::__cxx11::string::operator=(local_10,asStack_48);
    std::__cxx11::string::~string(asStack_48);
  }
  return local_28;
}

Assistant:

size_t Extract(const std::string& where_from, std::string& where_to, size_t pos, const char delim)
{
    size_t end = where_from.find_first_of(delim, pos);
    
    if (end != std::string::npos)
        where_to = where_from.substr(pos, end - pos);
    else
        where_to = where_from;
    
    return end;
}